

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O0

bool anon_unknown.dwarf_61ebba::extract_tar
               (string *outFileName,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *files,bool verbose,cmTarExtractTimestamps extractTimestamps,bool extract)

{
  archive *paVar1;
  bool bVar2;
  wchar_t wVar3;
  char *pcVar4;
  bool local_321;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  wchar_t local_1fc;
  char *pcStack_1f8;
  int ar;
  char *p;
  undefined1 local_1e8 [7];
  bool error_occured;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  string local_180;
  allocator<char> local_159;
  string local_158;
  string local_138;
  allocator<char> local_111;
  string local_110;
  wchar_t local_ec;
  undefined1 local_e8 [4];
  int r;
  reference local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *filename;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  string local_a0;
  archive *local_80;
  archive *matching;
  archive_entry *entry;
  archive *ext;
  archive *local_58;
  archive *a;
  cmLocaleRAII localeRAII;
  bool extract_local;
  cmTarExtractTimestamps extractTimestamps_local;
  bool verbose_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *outFileName_local;
  
  localeRAII.OldLocale.field_2._M_local_buf[0xf] = extract;
  cmLocaleRAII::cmLocaleRAII((cmLocaleRAII *)&a);
  local_58 = archive_read_new();
  entry = (archive_entry *)archive_write_disk_new();
  archive_read_support_filter_all(local_58);
  archive_read_support_format_all(local_58);
  local_80 = archive_match_new();
  if (local_80 == (archive *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"Out of memory",(allocator<char> *)((long)&__range1 + 7));
    cmSystemTools::Error(&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
    outFileName_local._7_1_ = false;
  }
  else {
    __end1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(files);
    filename = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(files);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&filename), paVar1 = local_58, bVar2) {
      local_c8 = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1);
      paVar1 = local_80;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      wVar3 = archive_match_include_pattern(paVar1,pcVar4);
      if (wVar3 != L'\0') {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8
                       ,"Failed to add to inclusion list: ",local_c8);
        cmSystemTools::Error((string *)local_e8);
        std::__cxx11::string::~string((string *)local_e8);
        outFileName_local._7_1_ = false;
        goto LAB_004735e4;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end1);
    }
    pcVar4 = (char *)std::__cxx11::string::c_str();
    local_ec = cm_archive_read_open_file(paVar1,pcVar4,0x2800);
    if (local_ec == L'\0') {
      local_ec = L'\0';
      while (local_ec = archive_read_next_header(local_58,(archive_entry **)&matching),
            local_ec != L'\x01') {
        if (local_ec != L'\0') {
          ArchiveError("Problem with archive_read_next_header(): ",local_58);
          break;
        }
        wVar3 = archive_match_excluded(local_80,(archive_entry *)matching);
        if (wVar3 == L'\0') {
          if (verbose) {
            if ((localeRAII.OldLocale.field_2._M_local_buf[0xf] & 1U) == 0) {
              list_item_verbose(_stdout,(archive_entry *)matching);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_110,"x ",&local_111);
              cmSystemTools::Stdout(&local_110);
              std::__cxx11::string::~string((string *)&local_110);
              std::allocator<char>::~allocator(&local_111);
              cm_archive_entry_pathname_abi_cxx11_(&local_138,(archive_entry *)matching);
              cmSystemTools::Stdout(&local_138);
              std::__cxx11::string::~string((string *)&local_138);
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"\n",&local_159)
            ;
            cmSystemTools::Stdout(&local_158);
            std::__cxx11::string::~string((string *)&local_158);
            std::allocator<char>::~allocator(&local_159);
          }
          else if ((localeRAII.OldLocale.field_2._M_local_buf[0xf] & 1U) == 0) {
            cm_archive_entry_pathname_abi_cxx11_(&local_180,(archive_entry *)matching);
            cmSystemTools::Stdout(&local_180);
            std::__cxx11::string::~string((string *)&local_180);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>((string *)&local_1a0,"\n",&local_1a1)
            ;
            cmSystemTools::Stdout(&local_1a0);
            std::__cxx11::string::~string((string *)&local_1a0);
            std::allocator<char>::~allocator(&local_1a1);
          }
          if ((localeRAII.OldLocale.field_2._M_local_buf[0xf] & 1U) != 0) {
            if (extractTimestamps == Yes) {
              local_ec = archive_write_disk_set_options((archive *)entry,L'\x04');
              if (local_ec != L'\0') {
                ArchiveError("Problem with archive_write_disk_set_options(): ",(archive *)entry);
                break;
              }
              local_ec = L'\0';
            }
            local_ec = archive_write_header((archive *)entry,(archive_entry *)matching);
            if (local_ec != L'\0') {
              ArchiveError("Problem with archive_write_header(): ",(archive *)entry);
              cm_archive_entry_pathname_abi_cxx11_((string *)local_1e8,(archive_entry *)matching);
              std::operator+(&local_1c8,"Current file: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_1e8);
              cmSystemTools::Error(&local_1c8);
              std::__cxx11::string::~string((string *)&local_1c8);
              std::__cxx11::string::~string((string *)local_1e8);
              break;
            }
            bVar2 = copy_data(local_58,(archive *)entry);
            if (!bVar2) break;
            local_ec = archive_write_finish_entry((archive *)entry);
            if (local_ec != L'\0') {
              ArchiveError("Problem with archive_write_finish_entry(): ",(archive *)entry);
              break;
            }
            local_ec = L'\0';
          }
        }
      }
      p._7_1_ = 0;
      if (local_80 != (archive *)0x0) {
        while (local_1fc = archive_match_path_unmatched_inclusions_next
                                     (local_80,&stack0xfffffffffffffe08), pcVar4 = pcStack_1f8,
              local_1fc == L'\0') {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_260,pcVar4,&local_261)
          ;
          std::operator+(&local_240,"tar: ",&local_260);
          std::operator+(&local_220,&local_240,": Not found in archive");
          cmSystemTools::Error(&local_220);
          std::__cxx11::string::~string((string *)&local_220);
          std::__cxx11::string::~string((string *)&local_240);
          std::__cxx11::string::~string((string *)&local_260);
          std::allocator<char>::~allocator(&local_261);
          p._7_1_ = 1;
        }
        if ((p._7_1_ & 1) != 0) {
          outFileName_local._7_1_ = false;
          goto LAB_004735e4;
        }
        if (local_1fc == L'\xffffffe2') {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_288,"tar: Out of memory",&local_289);
          cmSystemTools::Error(&local_288);
          std::__cxx11::string::~string((string *)&local_288);
          std::allocator<char>::~allocator(&local_289);
          outFileName_local._7_1_ = false;
          goto LAB_004735e4;
        }
      }
      archive_match_free(local_80);
      archive_write_free((archive *)entry);
      archive_read_close(local_58);
      archive_read_free(local_58);
      local_321 = (uint)local_ec < 2;
      outFileName_local._7_1_ = local_321;
    }
    else {
      ArchiveError("Problem with archive_read_open_file(): ",local_58);
      archive_write_free((archive *)entry);
      archive_read_close(local_58);
      outFileName_local._7_1_ = false;
    }
  }
LAB_004735e4:
  __range1._0_4_ = 1;
  cmLocaleRAII::~cmLocaleRAII((cmLocaleRAII *)&a);
  return outFileName_local._7_1_;
}

Assistant:

bool extract_tar(const std::string& outFileName,
                 const std::vector<std::string>& files, bool verbose,
                 cmSystemTools::cmTarExtractTimestamps extractTimestamps,
                 bool extract)
{
  cmLocaleRAII localeRAII;
  static_cast<void>(localeRAII);
  struct archive* a = archive_read_new();
  struct archive* ext = archive_write_disk_new();
  archive_read_support_filter_all(a);
  archive_read_support_format_all(a);
  struct archive_entry* entry;

  struct archive* matching = archive_match_new();
  if (matching == nullptr) {
    cmSystemTools::Error("Out of memory");
    return false;
  }

  for (const auto& filename : files) {
    if (archive_match_include_pattern(matching, filename.c_str()) !=
        ARCHIVE_OK) {
      cmSystemTools::Error("Failed to add to inclusion list: " + filename);
      return false;
    }
  }

  int r = cm_archive_read_open_file(a, outFileName.c_str(), 10240);
  if (r) {
    ArchiveError("Problem with archive_read_open_file(): ", a);
    archive_write_free(ext);
    archive_read_close(a);
    return false;
  }
  for (;;) {
    r = archive_read_next_header(a, &entry);
    if (r == ARCHIVE_EOF) {
      break;
    }
    if (r != ARCHIVE_OK) {
      ArchiveError("Problem with archive_read_next_header(): ", a);
      break;
    }

    if (archive_match_excluded(matching, entry)) {
      continue;
    }

    if (verbose) {
      if (extract) {
        cmSystemTools::Stdout("x ");
        cmSystemTools::Stdout(cm_archive_entry_pathname(entry));
      } else {
        list_item_verbose(stdout, entry);
      }
      cmSystemTools::Stdout("\n");
    } else if (!extract) {
      cmSystemTools::Stdout(cm_archive_entry_pathname(entry));
      cmSystemTools::Stdout("\n");
    }
    if (extract) {
      if (extractTimestamps == cmSystemTools::cmTarExtractTimestamps::Yes) {
        r = archive_write_disk_set_options(ext, ARCHIVE_EXTRACT_TIME);
        if (r != ARCHIVE_OK) {
          ArchiveError("Problem with archive_write_disk_set_options(): ", ext);
          break;
        }
      }

      r = archive_write_header(ext, entry);
      if (r == ARCHIVE_OK) {
        if (!copy_data(a, ext)) {
          break;
        }
        r = archive_write_finish_entry(ext);
        if (r != ARCHIVE_OK) {
          ArchiveError("Problem with archive_write_finish_entry(): ", ext);
          break;
        }
      }
#  ifdef _WIN32
      else if (const char* linktext = archive_entry_symlink(entry)) {
        std::cerr << "cmake -E tar: warning: skipping symbolic link \""
                  << cm_archive_entry_pathname(entry) << "\" -> \"" << linktext
                  << "\"." << std::endl;
      }
#  endif
      else {
        ArchiveError("Problem with archive_write_header(): ", ext);
        cmSystemTools::Error("Current file: " +
                             cm_archive_entry_pathname(entry));
        break;
      }
    }
  }